

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::EndMenu(void)

{
  ImGuiWindow *pIVar1;
  bool bVar2;
  undefined1 unaff_retaddr;
  int unaff_retaddr_00;
  ImGuiWindow *window;
  ImGuiContext *g;
  
  pIVar1 = GImGui->CurrentWindow;
  if ((((GImGui->NavWindow != (ImGuiWindow *)0x0) && (GImGui->NavWindow->ParentWindow == pIVar1)) &&
      (GImGui->NavMoveDir == 0)) &&
     ((bVar2 = NavMoveRequestButNoResultYet(), bVar2 && ((pIVar1->DC).LayoutType == 1)))) {
    ClosePopupToLevel(unaff_retaddr_00,(bool)unaff_retaddr);
    NavMoveRequestCancel();
  }
  EndPopup();
  return;
}

Assistant:

void ImGui::EndMenu()
{
    // Nav: When a left move request _within our child menu_ failed, close ourselves (the _parent_ menu).
    // A menu doesn't close itself because EndMenuBar() wants the catch the last Left<>Right inputs.
    // However, it means that with the current code, a BeginMenu() from outside another menu or a menu-bar won't be closable with the Left direction.
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (g.NavWindow && g.NavWindow->ParentWindow == window && g.NavMoveDir == ImGuiDir_Left && NavMoveRequestButNoResultYet() && window->DC.LayoutType == ImGuiLayoutType_Vertical)
    {
        ClosePopupToLevel(g.BeginPopupStack.Size, true);
        NavMoveRequestCancel();
    }

    EndPopup();
}